

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O0

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::rotateLeft(treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             *this,node *x)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  node *pnVar2;
  node *pnVar3;
  node *y;
  node *x_local;
  treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
  *this_local;
  
  ptVar1 = x->right;
  x->right = ptVar1->left;
  pnVar3 = ptVar1->left;
  pnVar2 = NIL(this);
  if (pnVar3 != pnVar2) {
    ptVar1->left->parent = x;
  }
  ptVar1->parent = x->parent;
  pnVar3 = root(this);
  if (x == pnVar3) {
    (this->m_tree).m_root = ptVar1;
  }
  else if (x == x->parent->left) {
    x->parent->left = ptVar1;
  }
  else if (x == x->parent->right) {
    x->parent->right = ptVar1;
  }
  ptVar1->left = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateLeft(node* x)
	{
		node*	y = x->right;

		x->right = y->left;
		if (y->left != this->NIL())
			y->left->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		y->left = x;
		x->parent = y;
	}